

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_string * __thiscall
pugi::impl::anon_unknown_0::string_value
          (xpath_string *__return_storage_ptr__,anon_unknown_0 *this,xpath_node *na,
          xpath_allocator *alloc)

{
  xml_node_struct *pxVar1;
  xml_node_struct *pxVar2;
  anon_unknown_0 *paVar3;
  undefined8 extraout_RAX;
  xpath_string *extraout_RAX_00;
  xpath_string *pxVar4;
  xpath_string *extraout_RAX_01;
  xpath_string *extraout_RAX_02;
  xpath_string *extraout_RAX_03;
  xml_node n;
  xpath_string local_48;
  
  pxVar2 = (xml_node_struct *)0x130449;
  if (na == (xpath_node *)0x0) {
    if (this == (anon_unknown_0 *)0x0) goto LAB_0012bde4;
    na = (xpath_node *)this;
    if (3 < (*(uint *)this & 0xf) - 3) {
      if ((*(uint *)this & 0xf) - 1 < 2) {
        __return_storage_ptr__->_buffer = "";
        __return_storage_ptr__->_uses_heap = false;
        __return_storage_ptr__->_length_heap = 0;
        paVar3 = *(anon_unknown_0 **)(this + 0x10);
        if (paVar3 == (anon_unknown_0 *)0x0) {
          paVar3 = (anon_unknown_0 *)0x130449;
        }
        if (paVar3->field_0x0 != '\0') {
          local_48._uses_heap = false;
          local_48._length_heap = 0;
          local_48._buffer = (char_t *)paVar3;
          xpath_string::append(__return_storage_ptr__,&local_48,alloc);
        }
        xml_node::xml_node((xml_node *)&local_48,*(xml_node_struct **)(this + 0x20));
        paVar3 = (anon_unknown_0 *)local_48._buffer;
        if ((anon_unknown_0 *)local_48._buffer == this ||
            (anon_unknown_0 *)local_48._buffer == (anon_unknown_0 *)0x0) {
          return (xpath_string *)
                 CONCAT71((int7)((ulong)extraout_RAX >> 8),
                          (anon_unknown_0 *)local_48._buffer == (anon_unknown_0 *)0x0);
        }
        do {
          if ((ulong)((uint)*(undefined8 *)&paVar3->field_0x0 & 0xf) - 3 < 2) {
            local_48._buffer = *(char_t **)(paVar3 + 0x10);
            if ((anon_unknown_0 *)local_48._buffer == (anon_unknown_0 *)0x0) {
              local_48._buffer = "";
            }
            local_48._uses_heap = false;
            local_48._length_heap = 0;
            xpath_string::append(__return_storage_ptr__,&local_48,alloc);
          }
          xml_node::xml_node((xml_node *)&local_48,*(xml_node_struct **)(paVar3 + 0x20));
          if ((anon_unknown_0 *)local_48._buffer == (anon_unknown_0 *)0x0) {
            xml_node::xml_node((xml_node *)&local_48,*(xml_node_struct **)(paVar3 + 0x30));
            if ((anon_unknown_0 *)local_48._buffer != (anon_unknown_0 *)0x0) {
LAB_0012befa:
              pxVar2 = *(xml_node_struct **)(paVar3 + 0x30);
              goto LAB_0012befe;
            }
            while( true ) {
              while (paVar3 == (anon_unknown_0 *)0x0) {
                xml_node::xml_node((xml_node *)&local_48);
                if ((this == (anon_unknown_0 *)0x0) ||
                   ((anon_unknown_0 *)local_48._buffer != (anon_unknown_0 *)0x0)) {
                  pxVar4 = extraout_RAX_02;
                  if (this != (anon_unknown_0 *)0x0) {
                    xml_node::xml_node((xml_node *)&local_48);
                    pxVar4 = extraout_RAX_03;
                    paVar3 = (anon_unknown_0 *)local_48._buffer;
                  }
                  goto LAB_0012bf0a;
                }
                xml_node::xml_node((xml_node *)&local_48);
                paVar3 = (anon_unknown_0 *)local_48._buffer;
              }
              xml_node::xml_node((xml_node *)&local_48,*(xml_node_struct **)(paVar3 + 0x30));
              if ((paVar3 == this) || ((anon_unknown_0 *)local_48._buffer != (anon_unknown_0 *)0x0))
              break;
              xml_node::xml_node((xml_node *)&local_48,*(xml_node_struct **)(paVar3 + 0x18));
              paVar3 = (anon_unknown_0 *)local_48._buffer;
            }
            pxVar4 = extraout_RAX_01;
            if (paVar3 != this) goto LAB_0012befa;
          }
          else {
            pxVar2 = *(xml_node_struct **)(paVar3 + 0x20);
LAB_0012befe:
            xml_node::xml_node((xml_node *)&local_48,pxVar2);
            pxVar4 = extraout_RAX_00;
            paVar3 = (anon_unknown_0 *)local_48._buffer;
          }
LAB_0012bf0a:
          if (paVar3 == (anon_unknown_0 *)0x0) {
            return pxVar4;
          }
          if (paVar3 == this) {
            return pxVar4;
          }
        } while( true );
      }
      goto LAB_0012bde4;
    }
  }
  pxVar1 = na[1]._node._root;
  if (pxVar1 != (xml_node_struct *)0x0) {
    pxVar2 = pxVar1;
  }
LAB_0012bde4:
  __return_storage_ptr__->_buffer = (char_t *)pxVar2;
  __return_storage_ptr__->_uses_heap = false;
  __return_storage_ptr__->_length_heap = 0;
  return (xpath_string *)pxVar2;
}

Assistant:

PUGI__FN xpath_string string_value(const xpath_node& na, xpath_allocator* alloc)
	{
		if (na.attribute())
			return xpath_string::from_const(na.attribute().value());
		else
		{
			xml_node n = na.node();

			switch (n.type())
			{
			case node_pcdata:
			case node_cdata:
			case node_comment:
			case node_pi:
				return xpath_string::from_const(n.value());

			case node_document:
			case node_element:
			{
				xpath_string result;

				// element nodes can have value if parse_embed_pcdata was used
				if (n.value()[0])
					result.append(xpath_string::from_const(n.value()), alloc);

				xml_node cur = n.first_child();

				while (cur && cur != n)
				{
					if (cur.type() == node_pcdata || cur.type() == node_cdata)
						result.append(xpath_string::from_const(cur.value()), alloc);

					if (cur.first_child())
						cur = cur.first_child();
					else if (cur.next_sibling())
						cur = cur.next_sibling();
					else
					{
						while (!cur.next_sibling() && cur != n)
							cur = cur.parent();

						if (cur != n) cur = cur.next_sibling();
					}
				}

				return result;
			}

			default:
				return xpath_string();
			}
		}
	}